

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathModValues(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr val;
  double dVar1;
  double arg2;
  double arg1;
  xmlXPathObjectPtr arg;
  xmlXPathParserContextPtr ctxt_local;
  
  val = xmlXPathValuePop(ctxt);
  if (val == (xmlXPathObjectPtr)0x0) {
    xmlXPathErr(ctxt,10);
  }
  else {
    dVar1 = xmlXPathCastToNumberInternal(ctxt,val);
    xmlXPathReleaseObject(ctxt->context,val);
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathNumberFunction(ctxt,1);
    }
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathErr(ctxt,0xb);
    }
    else if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar1 = fmod(ctxt->value->floatval,dVar1);
      ctxt->value->floatval = dVar1;
    }
    else {
      ctxt->value->floatval = xmlXPathNAN;
    }
  }
  return;
}

Assistant:

void
xmlXPathModValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg;
    double arg1, arg2;

    arg = xmlXPathValuePop(ctxt);
    if (arg == NULL)
	XP_ERROR(XPATH_INVALID_OPERAND);
    arg2 = xmlXPathCastToNumberInternal(ctxt, arg);
    xmlXPathReleaseObject(ctxt->context, arg);
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    arg1 = ctxt->value->floatval;
    if (arg2 == 0)
	ctxt->value->floatval = xmlXPathNAN;
    else {
	ctxt->value->floatval = fmod(arg1, arg2);
    }
}